

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<double> __thiscall Omega_h::min_each<double>(Omega_h *this,Read<double> *a,Read<double> *b)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  ulong uVar3;
  void *extraout_RDX;
  ulong uVar4;
  size_t sVar5;
  Read<double> RVar6;
  Write<double> c;
  type f;
  allocator local_71;
  Write<double> local_70;
  Write<signed_char> local_60;
  type local_50;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar4 = pAVar1->size;
  }
  else {
    uVar4 = (ulong)pAVar1 >> 3;
  }
  pAVar2 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar3 = pAVar2->size;
  }
  else {
    uVar3 = (ulong)pAVar2 >> 3;
  }
  if ((int)(uVar4 >> 3) == (int)(uVar3 >> 3)) {
    if (((ulong)pAVar1 & 1) == 0) {
      sVar5 = pAVar1->size;
    }
    else {
      sVar5 = (ulong)pAVar1 >> 3;
    }
    std::__cxx11::string::string((string *)&local_50,"",&local_71);
    Write<double>::Write(&local_70,(LO)(sVar5 >> 3),(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    Write<double>::Write((Write<double> *)&local_50,&local_70);
    Write<double>::Write((Write<double> *)&local_50.a,&a->write_);
    Write<double>::Write((Write<double> *)&local_50.b,&b->write_);
    if (((ulong)local_70.shared_alloc_.alloc & 1) == 0) {
      uVar4 = (local_70.shared_alloc_.alloc)->size;
    }
    else {
      uVar4 = (ulong)local_70.shared_alloc_.alloc >> 3;
    }
    parallel_for<Omega_h::min_each<double>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
              ((LO)(uVar4 >> 3),&local_50,"min_each");
    Write<double>::Write(&local_60,(Write<signed_char> *)&local_70);
    Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_60);
    Write<double>::~Write((Write<double> *)&local_60);
    min_each<double>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)&local_50);
    Write<double>::~Write(&local_70);
    RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<double>)RVar6.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x125);
}

Assistant:

Read<T> min_each(Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = min2(a[i], b[i]); };
  parallel_for(c.size(), f, "min_each");
  return c;
}